

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.hpp
# Opt level: O1

void __thiscall antlr::TreeParser::matchNot(TreeParser *this,RefAST *t,int ttype)

{
  ASTRef *pAVar1;
  int iVar2;
  int numTokens_;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  AST *pAVar3;
  AST *pAVar4;
  RefAST local_38;
  
  pAVar1 = t->ref;
  if ((pAVar1 != (ASTRef *)0x0) && (pAVar1->ptr != (AST *)0x0)) {
    if (pAVar1 == (ASTRef *)0x0) {
      pAVar3 = (AST *)0x0;
    }
    else {
      pAVar3 = pAVar1->ptr;
    }
    if (ASTNULL == (long *)0x0) {
      pAVar4 = (AST *)0x0;
    }
    else {
      pAVar4 = (AST *)*ASTNULL;
    }
    if (pAVar3 != pAVar4) {
      iVar2 = (*pAVar1->ptr->_vptr_AST[0x10])();
      if (iVar2 != ttype) {
        return;
      }
    }
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar2 = (*this->_vptr_TreeParser[8])(this);
  numTokens_ = (*this->_vptr_TreeParser[7])(this);
  local_38 = (RefAST)t->ref;
  if (local_38.ref == (ASTRef *)0x0) {
    local_38.ref = (ASTRef *)0x0;
  }
  else {
    (local_38.ref)->count = (local_38.ref)->count + 1;
  }
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar2),numTokens_,&local_38,ttype,true);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void matchNot(RefAST t, int ttype)
	{
		if ( !t || t == ASTNULL || t->getType() == ttype )
			throw MismatchedTokenException( getTokenNames(), getNumTokens(),
													  t, ttype, true );
	}